

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::handle_prevote_resp(raft_server *this,resp_msg *resp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int32 iVar6;
  __int_type_conflict _Var7;
  srv_role sVar8;
  __int_type_conflict _Var9;
  ulong uVar10;
  element_type *peVar11;
  undefined8 uVar12;
  unsigned_long uVar13;
  undefined4 *puVar14;
  uint *puVar15;
  resp_msg *in_RSI;
  long in_RDI;
  CbReturnCode rc;
  Param param;
  bool val;
  bool exp;
  int32 election_quorum_size;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  Param *in_stack_fffffffffffffc78;
  Type in_stack_fffffffffffffc84;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  int32_t my_id;
  undefined8 in_stack_fffffffffffffcb8;
  string *psVar16;
  undefined8 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  atomic<bool> *in_stack_fffffffffffffcd8;
  int32 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  char *local_260;
  undefined8 in_stack_fffffffffffffdd0;
  undefined1 force_vote;
  raft_server *in_stack_fffffffffffffdd8;
  raft_server *in_stack_fffffffffffffde0;
  Param local_208;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [38];
  undefined1 local_14a;
  undefined1 local_149;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  int local_e8;
  string local_d8 [32];
  string local_b8 [32];
  resp_msg *local_98;
  uint local_84;
  memory_order local_80;
  int local_7c;
  uint *local_78;
  undefined4 local_6c;
  memory_order local_68;
  int local_64;
  undefined4 *local_60;
  undefined4 local_54;
  memory_order local_50;
  int local_4c;
  undefined4 *local_48;
  undefined4 local_3c;
  memory_order local_38;
  int local_34;
  undefined4 *local_30;
  int local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  int *local_18;
  
  sVar8 = (srv_role)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
  force_vote = (undefined1)((ulong)in_stack_fffffffffffffdd0 >> 0x38);
  local_98 = in_RSI;
  uVar10 = msg_base::get_term(&in_RSI->super_msg_base);
  if (uVar10 == *(ulong *)(in_RDI + 200)) {
    bVar3 = resp_msg::get_accepted(local_98);
    if (bVar3) {
      std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RDI + 0xd8),0);
    }
    else {
      uVar10 = resp_msg::get_next_idx(local_98);
      uVar13 = std::numeric_limits<unsigned_long>::max();
      if (uVar10 == uVar13) {
        std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RDI + 0xdc),0);
      }
      else {
        std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RDI + 0xd4),0);
      }
    }
    iVar6 = get_quorum_for_election
                      ((raft_server *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8))
    ;
    local_e8 = iVar6 + 1;
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar3) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4ab1aa);
      iVar4 = (**(code **)(*(long *)peVar11 + 0x38))();
      if (3 < iVar4) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4ab1d0);
        uVar5 = msg_base::get_src(&local_98->super_msg_base);
        bVar3 = resp_msg::get_accepted(local_98);
        if (bVar3) {
          local_260 = "NO";
        }
        else {
          local_260 = "XX";
        }
        local_260 = local_260 + 1;
        uVar12 = *(undefined8 *)(in_RDI + 200);
        uVar10 = msg_base::get_term(&local_98->super_msg_base);
        std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x4ab271);
        srv_role_to_string_abi_cxx11_(sVar8);
        in_stack_fffffffffffffc78 = (Param *)std::__cxx11::string::c_str();
        puVar14 = (undefined4 *)(in_RDI + 0xd8);
        local_34 = 5;
        local_30 = puVar14;
        local_38 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_34 - 1U < 2) {
          local_3c = *puVar14;
        }
        else if (local_34 == 5) {
          local_3c = *puVar14;
        }
        else {
          local_3c = *puVar14;
        }
        uVar2 = local_3c;
        puVar14 = (undefined4 *)(in_RDI + 0xd4);
        local_4c = 5;
        local_48 = puVar14;
        local_50 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_4c - 1U < 2) {
          local_54 = *puVar14;
        }
        else if (local_4c == 5) {
          local_54 = *puVar14;
        }
        else {
          local_54 = *puVar14;
        }
        puVar14 = (undefined4 *)(in_RDI + 0xdc);
        local_64 = 5;
        in_stack_fffffffffffffc88 = local_54;
        local_60 = puVar14;
        local_68 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_64 - 1U < 2) {
          local_6c = *puVar14;
        }
        else if (local_64 == 5) {
          local_6c = *puVar14;
        }
        else {
          local_6c = *puVar14;
        }
        uVar1 = local_6c;
        in_stack_fffffffffffffd40 =
             get_num_voting_members
                       ((raft_server *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)
                       );
        in_stack_fffffffffffffd44 = in_stack_fffffffffffffc88;
        msg_if_given_abi_cxx11_
                  ((char *)local_108,
                   "[PRE-VOTE RESP] peer %d (%s), term %lu, resp term %lu, my role %s, dead %d, live %d, abandoned %d, num voting members %d, quorum %d\n"
                   ,(ulong)uVar5,local_260,uVar12,uVar10,in_stack_fffffffffffffc78,uVar2,
                   in_stack_fffffffffffffc88,uVar1,in_stack_fffffffffffffd40,local_e8);
        (**(code **)(*(long *)peVar11 + 0x40))
                  (peVar11,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_prevote_resp",0x1df,local_108);
        std::__cxx11::string::~string(local_108);
        std::__cxx11::string::~string(local_128);
      }
    }
    _Var7 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (local_e8 <= _Var7) {
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar3) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4ab639);
        iVar4 = (**(code **)(*(long *)peVar11 + 0x38))();
        if (3 < iVar4) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4ab65f);
          msg_if_given_abi_cxx11_
                    ((char *)local_148,"[PRE-VOTE DONE] SUCCESS, term %lu",
                     *(undefined8 *)(in_RDI + 200));
          (**(code **)(*(long *)peVar11 + 0x40))
                    (peVar11,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_prevote_resp",0x1e2,local_148);
          std::__cxx11::string::~string(local_148);
        }
      }
      local_149 = 0;
      local_14a = 1;
      bVar3 = std::atomic<bool>::compare_exchange_strong
                        (in_stack_fffffffffffffcd8,
                         (bool *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                         SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0),
                         (memory_order)in_stack_fffffffffffffcc8);
      if (bVar3) {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar3) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4ab77b);
          iVar4 = (**(code **)(*(long *)peVar11 + 0x38))();
          if (3 < iVar4) {
            peVar11 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x4ab7a1);
            msg_if_given_abi_cxx11_((char *)local_170,"[PRE-VOTE DONE] initiate actual vote");
            (**(code **)(*(long *)peVar11 + 0x40))
                      (peVar11,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"handle_prevote_resp",0x1e7,local_170);
            std::__cxx11::string::~string(local_170);
          }
        }
        initiate_vote(in_stack_fffffffffffffdd8,(bool)force_vote);
        sVar8 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x4ab853);
        if (sVar8 != leader) {
          restart_election_timer
                    ((raft_server *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
        }
      }
      else {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar3) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4ab89b);
          iVar4 = (**(code **)(*(long *)peVar11 + 0x38))();
          if (3 < iVar4) {
            peVar11 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x4ab8c1);
            msg_if_given_abi_cxx11_
                      ((char *)local_190,
                       "[PRE-VOTE DONE] actual vote is already initiated, do nothing");
            (**(code **)(*(long *)peVar11 + 0x40))
                      (peVar11,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"handle_prevote_resp",0x1f2,local_190);
            std::__cxx11::string::~string(local_190);
          }
        }
      }
    }
    _Var7 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (local_e8 <= _Var7) {
      local_18 = (int *)(in_RDI + 0xe0);
      local_1c = 1;
      local_20 = 5;
      local_24 = 1;
      LOCK();
      local_28 = *local_18;
      *local_18 = *local_18 + 1;
      UNLOCK();
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar3) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4abaae);
        iVar4 = (**(code **)(*(long *)peVar11 + 0x38))();
        if (2 < iVar4) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4abad4);
          puVar15 = (uint *)(in_RDI + 0xe0);
          local_7c = 5;
          local_78 = puVar15;
          local_80 = std::operator&(memory_order_seq_cst,__memory_order_mask);
          if (local_7c - 1U < 2) {
            local_84 = *puVar15;
          }
          else if (local_7c == 5) {
            local_84 = *puVar15;
          }
          else {
            local_84 = *puVar15;
          }
          psVar16 = local_1b0;
          msg_if_given_abi_cxx11_
                    ((char *)psVar16,"[PRE-VOTE] rejected by quorum, count %d",(ulong)local_84);
          (**(code **)(*(long *)peVar11 + 0x40))
                    (peVar11,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_prevote_resp",0x1f9,psVar16);
          std::__cxx11::string::~string(local_1b0);
        }
      }
      _Var7 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      _Var9 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (_Var9 <= _Var7) {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar3) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4abc5b);
          iVar4 = (**(code **)(*(long *)peVar11 + 0x38))();
          if (0 < iVar4) {
            peVar11 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x4abc81);
            psVar16 = local_1d0;
            msg_if_given_abi_cxx11_
                      ((char *)psVar16,
                       "too many pre-vote rejections, probably this node is not receiving heartbeat from leader. we should re-establish the network connection"
                      );
            (**(code **)(*(long *)peVar11 + 0x40))
                      (peVar11,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"handle_prevote_resp",0x1fe,psVar16);
            std::__cxx11::string::~string(local_1d0);
          }
        }
        send_reconnect_request(in_stack_fffffffffffffde0);
      }
    }
    _Var7 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (local_e8 <= _Var7) {
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar3) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4abd69);
        iVar4 = (**(code **)(*(long *)peVar11 + 0x38))();
        if (1 < iVar4) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4abd8f);
          psVar16 = local_1f0;
          msg_if_given_abi_cxx11_
                    ((char *)psVar16,"[PRE-VOTE DONE] this node has been removed, stepping down");
          (**(code **)(*(long *)peVar11 + 0x40))
                    (peVar11,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_prevote_resp",0x204,psVar16);
          std::__cxx11::string::~string(local_1f0);
        }
      }
      my_id = *(int32_t *)(in_RDI + 0x38);
      _Var7 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      cb_func::Param::Param(&local_208,my_id,_Var7,-1,(void *)0x0);
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x4abe5b);
      cb_func::call((cb_func *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                    in_stack_fffffffffffffc84,in_stack_fffffffffffffc78);
      *(undefined4 *)(in_RDI + 0x14c) = 2;
    }
  }
  else {
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar3) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4aaf5c);
      iVar4 = (**(code **)(*(long *)peVar11 + 0x38))();
      if (3 < iVar4) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4aaf82);
        uVar5 = msg_base::get_src(&local_98->super_msg_base);
        std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x4aafb2);
        srv_role_to_string_abi_cxx11_(sVar8);
        uVar12 = std::__cxx11::string::c_str();
        uVar10 = msg_base::get_term(&local_98->super_msg_base);
        msg_if_given_abi_cxx11_
                  ((char *)local_b8,
                   "[PRE-VOTE RESP] from peer %d, my role %s, but different resp term %lu (pre-vote term %lu). ignore it."
                   ,(ulong)uVar5,uVar12,uVar10,*(undefined8 *)(in_RDI + 200));
        (**(code **)(*(long *)peVar11 + 0x40))
                  (peVar11,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_prevote_resp",0x1c4,local_b8);
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string(local_d8);
      }
    }
  }
  return;
}

Assistant:

void raft_server::handle_prevote_resp(resp_msg& resp) {
    if (resp.get_term() != pre_vote_.term_) {
        // Vote response for other term. Should ignore it.
        p_in("[PRE-VOTE RESP] from peer %d, my role %s, "
             "but different resp term %" PRIu64 " (pre-vote term %" PRIu64 "). "
             "ignore it.",
             resp.get_src(), srv_role_to_string(role_).c_str(),
             resp.get_term(), pre_vote_.term_);
        return;
    }

    if (resp.get_accepted()) {
        // Accept: means that this peer is not receiving HB.
        pre_vote_.dead_++;
    } else {
        if (resp.get_next_idx() != std::numeric_limits<ulong>::max()) {
            // Deny: means that this peer still sees leader.
            pre_vote_.live_++;
        } else {
            // `next_idx_for_resp == MAX`, it is a special signal
            // indicating that this node has been already removed.
            pre_vote_.abandoned_++;
        }
    }

    int32 election_quorum_size = get_quorum_for_election() + 1;

    p_in("[PRE-VOTE RESP] peer %d (%s), term %" PRIu64 ", resp term %" PRIu64 ", "
         "my role %s, dead %d, live %d, abandoned %d, "
         "num voting members %d, quorum %d\n",
         resp.get_src(), (resp.get_accepted())?"O":"X",
         pre_vote_.term_, resp.get_term(),
         srv_role_to_string(role_).c_str(),
         pre_vote_.dead_.load(), pre_vote_.live_.load(), pre_vote_.abandoned_.load(),
         get_num_voting_members(), election_quorum_size);

    if (pre_vote_.dead_ >= election_quorum_size) {
        p_in("[PRE-VOTE DONE] SUCCESS, term %" PRIu64, pre_vote_.term_);

        bool exp = false;
        bool val = true;
        if (pre_vote_.done_.compare_exchange_strong(exp, val)) {
            p_in("[PRE-VOTE DONE] initiate actual vote");

            // Immediately initiate actual vote.
            initiate_vote();

            // restart the election timer if this is not yet a leader
            if (role_ != srv_role::leader) {
                restart_election_timer();
            }

        } else {
            p_in("[PRE-VOTE DONE] actual vote is already initiated, do nothing");
        }
    }

    if (pre_vote_.live_ >= election_quorum_size) {
        pre_vote_.quorum_reject_count_.fetch_add(1);
        p_wn("[PRE-VOTE] rejected by quorum, count %d",
             pre_vote_.quorum_reject_count_.load());
        if ( pre_vote_.quorum_reject_count_ >=
                 raft_server::raft_limits_.pre_vote_rejection_limit_ ) {
            p_ft("too many pre-vote rejections, probably this node is not "
                 "receiving heartbeat from leader. "
                 "we should re-establish the network connection");
            send_reconnect_request();
        }
    }

    if (pre_vote_.abandoned_ >= election_quorum_size) {
        p_er("[PRE-VOTE DONE] this node has been removed, stepping down");
        cb_func::Param param(id_, leader_);
        CbReturnCode rc = ctx_->cb_func_.call( cb_func::RemovedFromCluster,
                                               &param );
        (void)rc;
        steps_to_down_ = 2;
    }
}